

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,SwitchStmt *stmt)

{
  undefined1 *puVar1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  element_type *peVar4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  long lVar7;
  pointer psVar8;
  ostream *poVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  const_iterator cVar12;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var13;
  iterator iVar14;
  VarException *this_00;
  long lVar15;
  char *pcVar16;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __normal_iterator<std::shared_ptr<kratos::Const>_*,_std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>_>
  __i;
  __shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *p_Var17;
  undefined1 auVar18 [8];
  string_view sVar19;
  basic_string_view<char> bVar20;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  SwitchStmt *local_138;
  element_type *local_130;
  Var *local_128 [2];
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_118;
  Var *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  string local_e8;
  __shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Base_ptr local_c0;
  _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_b8;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *local_b0;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range1;
  SwitchStmt *local_a0;
  undefined1 auStack_98 [8];
  vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_> conds;
  __shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> local_78;
  string local_60;
  ostream *local_40;
  allocator<char> local_32;
  allocator_type local_31;
  
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  sVar19 = indent(this);
  local_40 = (ostream *)puVar1;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar19._M_str,sVar19._M_len);
  pcVar16 = "";
  if ((this->options_).unique_case != false) {
    pcVar16 = "unique";
  }
  poVar9 = std::operator<<(poVar9,pcVar16);
  poVar9 = std::operator<<(poVar9," case (");
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)&local_e8,
             &(stmt->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  __range1 = (map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
              *)&this->stream_;
  Stream::var_str_abi_cxx11_(&local_60,&this->stream_,(Var *)local_e8._M_dataplus._M_p);
  poVar9 = std::operator<<(poVar9,(string *)&local_60);
  poVar9 = std::operator<<(poVar9,")");
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  std::operator<<(poVar9,'\n');
  std::__cxx11::string::~string((string *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
  this->indent_ = this->indent_ + 1;
  auStack_98 = (undefined1  [8])0x0;
  conds.
  super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  conds.
  super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = stmt;
  std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>::
  reserve((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
           *)auStack_98,(stmt->body_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_b0 = &local_a0->body_;
  p_Var2 = &(local_a0->body_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var10 = (local_a0->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      psVar8 = conds.
               super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
               ._M_impl.super__Vector_impl_data._M_start, auVar18 = auStack_98,
      (_Rb_tree_header *)p_Var10 != p_Var2; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    if (*(long *)(p_Var10 + 1) != 0) {
      std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
      emplace_back<std::shared_ptr<kratos::Const>const&>
                ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
                  *)auStack_98,(shared_ptr<kratos::Const> *)(p_Var10 + 1));
    }
  }
  local_c0 = &p_Var2->_M_header;
  if (auStack_98 !=
      (undefined1  [8])
      conds.
      super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar15 = (long)conds.
                   super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_98;
    uVar11 = lVar15 >> 4;
    lVar7 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
              (auStack_98,
               conds.
               super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
               ._M_impl.super__Vector_impl_data._M_start,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar15 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
                (auVar18,psVar8);
    }
    else {
      p_Var17 = (__shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *)((long)auVar18 + 0x100);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
                (auVar18,p_Var17);
      for (; p_Var17 != &psVar8->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>;
          p_Var17 = p_Var17 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Const>*,std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::SystemVerilogCodeGen::stmt_code(kratos::SwitchStmt*)::__0>>
                  (p_Var17);
      }
    }
  }
  local_60._M_dataplus._M_p = (pointer)0x0;
  std::vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>::
  emplace_back<decltype(nullptr)>
            ((vector<std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>>
              *)auStack_98,(void **)&local_60);
  local_c8 = &(conds.
               super__Vector_base<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>;
  local_b8 = &(this->label_index_)._M_h;
  auVar18 = auStack_98;
  do {
    if (auVar18 == (undefined1  [8])local_c8) {
      this->indent_ = this->indent_ - 1;
      sVar19 = indent(this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_40,sVar19._M_str,sVar19._M_len);
      poVar9 = std::operator<<(poVar9,"endcase");
      puVar1 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar1 = *(long *)puVar1 + 1;
      std::operator<<(poVar9,'\n');
      std::vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
      ::~vector((vector<std::shared_ptr<kratos::Const>,_std::allocator<std::shared_ptr<kratos::Const>_>_>
                 *)auStack_98);
      return;
    }
    cVar12 = std::
             _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
             ::find(&local_b0->_M_t,(key_type *)auVar18);
    if (cVar12._M_node == local_c0) {
      local_78._M_ptr = (element_type *)0x0;
      local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var13 = &std::
                 map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 ::at(local_b0,(key_type *)auVar18)->
                 super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_78,p_Var13);
    }
    sVar19 = indent(this);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_40,sVar19._M_str,sVar19._M_len);
    peVar4 = ((__shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *)auVar18)->_M_ptr;
    if (peVar4 == (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"default",&local_32);
    }
    else {
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Const,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_f8,
                 (__shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *)auVar18);
      Stream::var_str_abi_cxx11_(&local_60,(Stream *)__range1,local_f8);
    }
    poVar9 = std::operator<<(poVar9,(string *)&local_60);
    std::operator<<(poVar9,": ");
    std::__cxx11::string::~string((string *)&local_60);
    if (peVar4 != (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
    }
    if ((Var *)local_78._M_ptr == (Var *)0x0) {
LAB_001a749c:
      poVar9 = std::operator<<(local_40,"begin end");
      puVar1 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar1 = *(long *)puVar1 + 1;
      std::operator<<(poVar9,'\n');
    }
    else {
      p_Var5 = (_Hash_node_base *)
               (((unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
                  *)((long)local_78._M_ptr + 0xb8))->_M_h)._M_bucket_count;
      p_Var6 = (((unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
                  *)((long)local_78._M_ptr + 0xb8))->_M_h)._M_before_begin._M_nxt;
      if (p_Var5 == p_Var6) {
        if (((__shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *)auVar18)->_M_ptr !=
            (element_type *)0x0) {
          this_00 = (VarException *)__cxa_allocate_exception(0x10);
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::Const,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_128,
                     (__shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *)auVar18);
          Stream::var_str_abi_cxx11_(&local_e8,(Stream *)__range1,local_128[0]);
          local_118.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._M_dataplus._M_p;
          local_118.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8._M_string_length;
          bVar20 = fmt::v7::to_string_view<char,_0>("Switch statement condition {0} is empty!");
          format_str.data_ = (char *)bVar20.size_;
          format_str.size_ = 0xd;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_118;
          fmt::v7::detail::vformat_abi_cxx11_(&local_60,(detail *)bVar20.data_,format_str,args);
          local_138 = local_a0;
          local_130 = ((__shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *)auVar18)->_M_ptr;
          __l._M_len = 2;
          __l._M_array = (iterator)&local_138;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_118,__l,&local_31);
          VarException::VarException(this_00,&local_60,&local_118);
          __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (((__shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2> *)auVar18)->_M_ptr ==
            (element_type *)0x0) goto LAB_001a749c;
      }
      if ((long)p_Var6 - (long)p_Var5 == 0x10) {
        local_e8._M_dataplus._M_p = (pointer)local_78._M_ptr;
        iVar14 = std::
                 _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(local_b8,(key_type *)&local_e8);
        if (iVar14.
            super__Node_iterator_base<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)&local_60,
                     (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                     (((unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
                        *)((long)local_78._M_ptr + 0xb8))->_M_h)._M_bucket_count);
          iVar3 = *(int *)(local_60._M_dataplus._M_p + 0x78);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
          if (iVar3 == 3) {
            this->skip_indent_ = true;
            std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)&local_60,
                       (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                       (((unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
                          *)((long)local_78._M_ptr + 0xb8))->_M_h)._M_bucket_count);
            (**this->_vptr_SystemVerilogCodeGen)(this,local_60._M_dataplus._M_p);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
            goto LAB_001a74be;
          }
        }
      }
      this->indent_ = this->indent_ + 1;
      (**this->_vptr_SystemVerilogCodeGen)(this);
      this->indent_ = this->indent_ - 1;
    }
LAB_001a74be:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    auVar18 = (undefined1  [8])((long)auVar18 + 0x10);
  } while( true );
}

Assistant:

void SystemVerilogCodeGen::stmt_code(SwitchStmt* stmt) {
    stream_ << indent() << (options_.unique_case ? "unique" : "") << " case ("
            << stream_.var_str(stmt->target()) << ")" << stream_.endl();
    indent_++;
    auto const& body = stmt->body();
    std::vector<std::shared_ptr<Const>> conds;
    conds.reserve(body.size());
    for (auto const& iter : body) {
        if (iter.first) conds.emplace_back(iter.first);
    }
    std::sort(conds.begin(), conds.end(),
              [](const auto& lhs, const auto& rhs) { return lhs->value() < rhs->value(); });
    conds.emplace_back(nullptr);

    for (auto& cond : conds) {
        const auto& stmt_blk = (body.find(cond) != body.end()) ? body.at(cond) : nullptr;
        stream_ << indent() << (cond ? stream_.var_str(cond) : "default") << ": ";
        if (stmt_blk && stmt_blk->empty() && cond) {
            throw VarException(
                ::format("Switch statement condition {0} is empty!", stream_.var_str(cond)),
                {stmt, cond.get()});
        } else if (!stmt_blk || (stmt_blk->empty() && !cond)) {
            //  empty default case
            stream_ << "begin end" << stream_.endl();
        } else {
            // directly output the code if the block only has 1 element
            if (stmt_blk->size() == 1 && label_index_.find(stmt_blk.get()) == label_index_.end() &&
                stmt_blk->get_stmt(0)->type() == StatementType::Assign) {
                skip_indent_ = true;
                dispatch_node((*stmt_blk)[0].get());
            } else {
                indent_++;
                dispatch_node(stmt_blk.get());
                indent_--;
            }
        }
    }

    indent_--;
    stream_ << indent() << "endcase" << stream_.endl();
}